

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::setGyroConfig(RTIMUMPU9250 *this)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = this->m_gyroLpf;
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                             '\x1b',(bVar1 >> 3 & 3) + this->m_gyroFsr,"Failed to write gyro config"
                            );
  if (bVar2) {
    bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               '\x1a',bVar1 & 7,"Failed to write gyro lpf");
    return bVar2;
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::setGyroConfig()
{
    unsigned char gyroConfig = m_gyroFsr + ((m_gyroLpf >> 3) & 3);
    unsigned char gyroLpf = m_gyroLpf & 7;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_GYRO_CONFIG, gyroConfig, "Failed to write gyro config"))
         return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_GYRO_LPF, gyroLpf, "Failed to write gyro lpf"))
         return false;
    return true;
}